

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormatSymbols::DecimalFormatSymbols(DecimalFormatSymbols *this)

{
  long lVar1;
  Locale *other;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DecimalFormatSymbols_003cb8f0;
  lVar1 = 0x10;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003daac8;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x710);
  (this->fNoSymbol).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (this->fNoSymbol).fUnion.fStackFields.fLengthAndFlags = 2;
  other = Locale::getRoot();
  Locale::Locale(&this->locale,other);
  this->currPattern = (char16_t *)0x0;
  lVar1 = 0x980;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003daac8;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xa40);
  lVar1 = 0xa40;
  do {
    *(undefined ***)((long)this + lVar1 + -8) = &PTR__UnicodeString_003daac8;
    *(undefined2 *)((long)&(this->super_UObject)._vptr_UObject + lVar1) = 2;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xb00);
  this->actualLocale[0] = '\0';
  this->validLocale[0] = '\0';
  initialize(this);
  return;
}

Assistant:

DecimalFormatSymbols::DecimalFormatSymbols()
        : UObject(), locale(Locale::getRoot()), currPattern(NULL) {
    *validLocale = *actualLocale = 0;
    initialize();
}